

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsCommon.cpp
# Opt level: O1

string * helics::zeromq::getZMQVersion_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  undefined8 uVar12;
  string *in_RDI;
  uint uVar13;
  string __str;
  tuple<int,_int,_int> vers;
  string __str_2;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined8 local_104;
  uint local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  local_104 = 0;
  local_fc = 0;
  local_38 = in_RDI;
  zmq_version(&local_fc,(long)&local_104 + 4,&local_104);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ZMQ v","");
  uVar4 = -local_fc;
  if (0 < (int)local_fc) {
    uVar4 = local_fc;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_002d3b9b;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_002d3b9b;
      }
      if (uVar8 < 10000) goto LAB_002d3b9b;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_002d3b9b:
  iVar5 = (int)local_fc >> 0x1f;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_148,(ulong)(uVar13 + -iVar5),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_148._M_dataplus._M_p + (uint)-iVar5,uVar13,uVar4);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    uVar12 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_148._M_string_length + local_78._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      uVar12 = local_148.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_148._M_string_length + local_78._M_string_length) goto LAB_002d3c0f;
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_148,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  else {
LAB_002d3c0f:
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_78,local_148._M_dataplus._M_p,local_148._M_string_length);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar2 == paVar9) {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_f8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_f8,local_f8._M_string_length,0,1,'.');
  local_128._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar9) {
    local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  }
  else {
    local_128.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_128._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  uVar4 = -local_104._4_4_;
  if (0 < (int)local_104._4_4_) {
    uVar4 = local_104._4_4_;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_002d3d3a;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_002d3d3a;
      }
      if (uVar8 < 10000) goto LAB_002d3d3a;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_002d3d3a:
  iVar5 = (int)local_104._4_4_ >> 0x1f;
  paVar9 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar9;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_98,(ulong)(uVar13 + -iVar5),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_98._M_dataplus._M_p + (uint)-iVar5,uVar13,uVar4);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    uVar12 = local_128.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_98._M_string_length + local_128._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar9) {
      uVar12 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_98._M_string_length + local_128._M_string_length) goto LAB_002d3dbb;
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_98,0,0,local_128._M_dataplus._M_p,local_128._M_string_length);
  }
  else {
LAB_002d3dbb:
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_128,local_98._M_dataplus._M_p,local_98._M_string_length);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar2 = &pbVar7->field_2;
  if (paVar10 == paVar2) {
    local_d8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar7->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_d8,local_d8._M_string_length,0,1,'.');
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar10) {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_58._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  uVar4 = -(uint)local_104;
  if (0 < (int)(uint)local_104) {
    uVar4 = (uint)local_104;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_002d3efe;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_002d3efe;
      }
      if (uVar8 < 10000) goto LAB_002d3efe;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_002d3efe:
  iVar5 = (int)(uint)local_104 >> 0x1f;
  paVar10 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar10;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_b8,(ulong)(uVar13 + -iVar5),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_b8._M_dataplus._M_p + (uint)-iVar5,uVar13,uVar4);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    uVar12 = local_58.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_b8._M_string_length + local_58._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar10) {
      uVar12 = local_b8.field_2._M_allocated_capacity;
    }
    if (local_b8._M_string_length + local_58._M_string_length <= (ulong)uVar12) {
      pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_b8,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
      goto LAB_002d3fb8;
    }
  }
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_58,local_b8._M_dataplus._M_p,local_b8._M_string_length);
LAB_002d3fb8:
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  pcVar3 = (pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar12 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_38->field_2 + 8) = uVar12;
  }
  else {
    (local_38->_M_dataplus)._M_p = pcVar3;
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar10) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar9) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return local_38;
}

Assistant:

std::string getZMQVersion()
{
    auto vers = zmq::version();
    return std::string("ZMQ v") + std::to_string(std::get<0>(vers)) + '.' +
        std::to_string(std::get<1>(vers)) + '.' + std::to_string(std::get<2>(vers));
}